

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

int Acb_ObjToGia(Gia_Man_t *pNew,Acb_Ntk_t *p,int iObj,Vec_Int_t *vTemp)

{
  int iVar1;
  int iVar2;
  Acb_ObjType_t AVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  bool bVar7;
  
  iVar1 = Acb_ObjIsCio(p,iObj);
  if (iVar1 != 0) {
    __assert_fail("!Acb_ObjIsCio(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbFunc.c"
                  ,0x297,"int Acb_ObjToGia(Gia_Man_t *, Acb_Ntk_t *, int, Vec_Int_t *)");
  }
  vTemp->nSize = 0;
  piVar5 = Acb_ObjFanins(p,iObj);
  for (lVar6 = 0; lVar6 < *piVar5; lVar6 = lVar6 + 1) {
    iVar1 = piVar5[lVar6 + 1];
    iVar2 = Acb_ObjCopy(p,iVar1);
    if (iVar2 < 0) {
      __assert_fail("Acb_ObjCopy(p, iFanin) >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbFunc.c"
                    ,0x29b,"int Acb_ObjToGia(Gia_Man_t *, Acb_Ntk_t *, int, Vec_Int_t *)");
    }
    iVar1 = Acb_ObjCopy(p,iVar1);
    Vec_IntPush(vTemp,iVar1);
  }
  AVar3 = Acb_ObjType(p,iObj);
  switch(AVar3 & 0xff) {
  case ABC_OPER_CONST_F:
    iVar1 = 0;
    break;
  case ABC_OPER_CONST_T:
    iVar1 = 1;
    break;
  default:
    if (AVar3 - ABC_OPER_BIT_AND < 2) {
      iVar1 = 1;
      for (iVar2 = 0; iVar2 < vTemp->nSize; iVar2 = iVar2 + 1) {
        iVar4 = Vec_IntEntry(vTemp,iVar2);
        iVar1 = Gia_ManHashAnd(pNew,iVar1,iVar4);
      }
      bVar7 = AVar3 == ABC_OPER_BIT_NAND;
    }
    else if (AVar3 - ABC_OPER_BIT_OR < 2) {
      iVar1 = 0;
      for (iVar2 = 0; iVar2 < vTemp->nSize; iVar2 = iVar2 + 1) {
        iVar4 = Vec_IntEntry(vTemp,iVar2);
        iVar1 = Gia_ManHashOr(pNew,iVar1,iVar4);
      }
      bVar7 = AVar3 == ABC_OPER_BIT_NOR;
    }
    else {
      if (1 < AVar3 - ABC_OPER_BIT_XOR) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbFunc.c"
                      ,700,"int Acb_ObjToGia(Gia_Man_t *, Acb_Ntk_t *, int, Vec_Int_t *)");
      }
      iVar1 = 0;
      for (iVar2 = 0; iVar2 < vTemp->nSize; iVar2 = iVar2 + 1) {
        iVar4 = Vec_IntEntry(vTemp,iVar2);
        iVar1 = Gia_ManHashXor(pNew,iVar1,iVar4);
      }
      bVar7 = AVar3 == ABC_OPER_BIT_NXOR;
    }
    iVar1 = Abc_LitNotCond(iVar1,(uint)bVar7);
    return iVar1;
  case ABC_OPER_BIT_BUF:
    iVar1 = Vec_IntEntry(vTemp,0);
    return iVar1;
  case ABC_OPER_BIT_INV:
    iVar1 = Vec_IntEntry(vTemp,0);
    iVar1 = Abc_LitNot(iVar1);
    return iVar1;
  }
  return iVar1;
}

Assistant:

int Acb_ObjToGia( Gia_Man_t * pNew, Acb_Ntk_t * p, int iObj, Vec_Int_t * vTemp )
{
    //char * pName = Abc_NamStr( p->pDesign->pStrs, Acb_ObjName(p, iObj) );
    int * pFanin, iFanin, k, Type, Res;
    assert( !Acb_ObjIsCio(p, iObj) );
    Vec_IntClear( vTemp );
    Acb_ObjForEachFaninFast( p, iObj, pFanin, iFanin, k )
    {
        assert( Acb_ObjCopy(p, iFanin) >= 0 );
        Vec_IntPush( vTemp, Acb_ObjCopy(p, iFanin) );
    }
    Type = Acb_ObjType( p, iObj );
    if ( Type == ABC_OPER_CONST_F ) 
        return 0;
    if ( Type == ABC_OPER_CONST_T ) 
        return 1;
    if ( Type == ABC_OPER_BIT_BUF ) 
        return Vec_IntEntry(vTemp, 0);
    if ( Type == ABC_OPER_BIT_INV ) 
        return Abc_LitNot( Vec_IntEntry(vTemp, 0) );
    if ( Type == ABC_OPER_BIT_AND || Type == ABC_OPER_BIT_NAND )
    {
        Res = 1;
        Vec_IntForEachEntry( vTemp, iFanin, k )
            Res = Gia_ManHashAnd( pNew, Res, iFanin );
        return Abc_LitNotCond( Res, Type == ABC_OPER_BIT_NAND );
    }
    if ( Type == ABC_OPER_BIT_OR || Type == ABC_OPER_BIT_NOR )
    {
        Res = 0;
        Vec_IntForEachEntry( vTemp, iFanin, k )
            Res = Gia_ManHashOr( pNew, Res, iFanin );
        return Abc_LitNotCond( Res, Type == ABC_OPER_BIT_NOR );
    }
    if ( Type == ABC_OPER_BIT_XOR || Type == ABC_OPER_BIT_NXOR )
    {
        Res = 0;
        Vec_IntForEachEntry( vTemp, iFanin, k )
            Res = Gia_ManHashXor( pNew, Res, iFanin );
        return Abc_LitNotCond( Res, Type == ABC_OPER_BIT_NXOR );
    }
    assert( 0 );
    return -1;
}